

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O2

void __thiscall
spdlog::details::thread_pool::thread_pool
          (thread_pool *this,size_t q_max_items,size_t threads_n,function<void_()> *on_thread_start,
          function<void_()> *on_thread_stop)

{
  vector<std::thread,_std::allocator<std::thread>_> *__alloc;
  pointer *pptVar1;
  allocator_type *__a;
  thread *__first;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  thread *ptVar3;
  anon_class_72_3_9989dd16_for__M_head_impl *__args;
  anon_class_72_3_9989dd16_for__M_head_impl *__args_00;
  bool bVar4;
  thread local_98;
  function<void_()> local_90;
  function<void_()> local_70;
  string local_50;
  
  mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue(&this->q_,q_max_items);
  __alloc = &this->threads_;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0xfffffffffffffc17 < threads_n - 0x3e9) {
    while (bVar4 = threads_n != 0, threads_n = threads_n - 1, bVar4) {
      local_98._M_id._M_thread = (id)(id)this;
      std::function<void_()>::function(&local_90,on_thread_start);
      std::function<void_()>::function(&local_70,on_thread_stop);
      __a = (allocator_type *)
            (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish;
      if (__a == (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (__alloc,1,"vector::_M_realloc_insert");
        __first = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                             (&__alloc->
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::__0>
                  ((allocator_type *)(((long)__a - (long)__first) + (long)__result),&local_98,
                   __args_00);
        ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (__first,(thread *)__a,__result,(allocator<std::thread> *)__alloc);
        ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)__a,ptVar3,ptVar2 + 1,(allocator<std::thread> *)__alloc);
        if (__first != (thread *)0x0) {
          operator_delete(__first);
        }
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = __result;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar3;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __result + __n;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::__0>
                  (__a,&local_98,__args);
        pptVar1 = &(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::$_0::
      ~__0((__0 *)&local_98);
    }
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             "spdlog::thread_pool(): invalid threads_n param (valid range is 1-1000)",
             (allocator *)&local_98);
  throw_spdlog_ex(&local_50);
}

Assistant:

SPDLOG_INLINE thread_pool::thread_pool(size_t q_max_items,
                                       size_t threads_n,
                                       std::function<void()> on_thread_start,
                                       std::function<void()> on_thread_stop)
    : q_(q_max_items) {
    if (threads_n == 0 || threads_n > 1000) {
        throw_spdlog_ex(
            "spdlog::thread_pool(): invalid threads_n param (valid "
            "range is 1-1000)");
    }
    for (size_t i = 0; i < threads_n; i++) {
        threads_.emplace_back([this, on_thread_start, on_thread_stop] {
            on_thread_start();
            this->thread_pool::worker_loop_();
            on_thread_stop();
        });
    }
}